

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O1

ReadResult __thiscall
absl::cord_internal::CordRepBtreeNavigator::Read
          (CordRepBtreeNavigator *this,size_t edge_offset,size_t n)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  uint8_t uVar5;
  CordRep *pCVar6;
  ulong uVar7;
  CordRep *pCVar8;
  ulong n_00;
  ulong uVar9;
  ulong uVar10;
  CordRepBtree *rep;
  ulong uVar11;
  CordRepBtree *pCVar12;
  long lVar13;
  ReadResult RVar14;
  CordRep *local_50;
  
  bVar3 = this->index_[0];
  uVar9 = (ulong)bVar3;
  pCVar12 = this->node_[0];
  if (bVar3 < (pCVar12->super_CordRep).storage[1]) {
LAB_0014080f:
    __assert_fail("index >= begin()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  if ((pCVar12->super_CordRep).storage[2] <= bVar3) {
LAB_001407f0:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  rep = (CordRepBtree *)pCVar12->edges_[uVar9];
  uVar11 = (rep->super_CordRep).length;
  if (uVar11 < edge_offset || uVar11 - edge_offset == 0) {
    __assert_fail("edge_offset < edge->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x72,
                  "ReadResult absl::cord_internal::CordRepBtreeNavigator::Read(size_t, size_t)");
  }
  n_00 = n + edge_offset;
  if (n_00 < uVar11) {
    local_50 = anon_unknown_10::Substring((CordRep *)rep,edge_offset,n);
  }
  else {
    pCVar6 = anon_unknown_10::Substring((CordRep *)rep,edge_offset,uVar11 - edge_offset);
    local_50 = (CordRep *)operator_new(0x40);
    (local_50->refcount).count_.super___atomic_base<int>._M_i = 2;
    uVar11 = 0;
    uVar5 = '\0';
    if (pCVar6->tag == '\x03') {
      uVar5 = pCVar6->storage[0] + '\x01';
    }
    local_50->length = pCVar6->length;
    local_50->tag = '\x03';
    local_50->storage[0] = uVar5;
    local_50->storage[1] = '\0';
    local_50->storage[2] = '\x01';
    local_50[1].length = (size_t)pCVar6;
    lVar13 = 1;
    do {
      n_00 = n_00 - (rep->super_CordRep).length;
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)(pCVar12->super_CordRep).storage[2];
      if (uVar9 == uVar7) {
        uVar11 = (ulong)(int)uVar11;
        do {
          this->index_[uVar11] = (uint8_t)uVar9;
          if ((long)this->height_ <= (long)uVar11) {
            local_50->storage[2] = (uint8_t)lVar13;
            if (n_00 == 0) {
              n_00 = 0;
            }
            else {
              if (local_50 == (CordRep *)0x0) {
                __assert_fail("rep != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                              ,0x377,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
              }
              LOCK();
              pRVar1 = &local_50->refcount;
              uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
              (pRVar1->count_).super___atomic_base<int>._M_i =
                   (pRVar1->count_).super___atomic_base<int>._M_i + -2;
              UNLOCK();
              if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
                __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                              ,0xaa,
                              "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()"
                             );
              }
              if (uVar2 == 2) {
                CordRep::Destroy(local_50);
              }
              local_50 = (CordRep *)0x0;
            }
            goto LAB_0014079a;
          }
          pCVar6 = local_50;
          if (n_00 != 0) {
            local_50->storage[2] = (uint8_t)lVar13;
            pCVar6 = (CordRep *)operator_new(0x40);
            (pCVar6->refcount).count_.super___atomic_base<int>._M_i = 2;
            if (local_50->tag == '\x03') {
              uVar5 = local_50->storage[0] + '\x01';
            }
            else {
              uVar5 = '\0';
            }
            pCVar6->length = local_50->length;
            pCVar6->tag = '\x03';
            pCVar6->storage[0] = uVar5;
            pCVar6->storage[1] = '\0';
            pCVar6->storage[2] = '\x01';
            pCVar6[1].length = (size_t)local_50;
            lVar13 = 1;
          }
          pCVar12 = this->node_[uVar11 + 1];
          uVar9 = (ulong)this->index_[uVar11 + 1] + 1;
          uVar7 = (ulong)(pCVar12->super_CordRep).storage[2];
          uVar11 = uVar11 + 1;
          local_50 = pCVar6;
        } while (uVar9 == uVar7);
      }
      if (uVar9 < (pCVar12->super_CordRep).storage[1]) goto LAB_0014080f;
      if (uVar7 <= uVar9) goto LAB_001407f0;
      rep = (CordRepBtree *)pCVar12->edges_[uVar9];
      uVar7 = (rep->super_CordRep).length;
      if (uVar7 <= n_00) {
        local_50->length = local_50->length + uVar7;
        LOCK();
        pRVar1 = &(rep->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        *(CordRepBtree **)(local_50[1].storage + lVar13 * 8 + -0xd) = rep;
        lVar13 = lVar13 + 1;
      }
    } while ((rep->super_CordRep).length <= n_00);
    local_50->length = local_50->length + n_00;
    pCVar6 = local_50;
    if (0 < (int)uVar11) {
      pCVar8 = local_50;
      uVar11 = uVar11 & 0xffffffff;
      do {
        if ((rep->super_CordRep).tag != '\x03') {
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        this->index_[uVar11] = (uint8_t)uVar9;
        this->node_[uVar11 - 1] = rep;
        bVar3 = (rep->super_CordRep).storage[1];
        uVar9 = (ulong)bVar3;
        if ((rep->super_CordRep).storage[2] <= bVar3) goto LAB_001407f0;
        pCVar12 = (CordRepBtree *)rep->edges_[uVar9];
        if (n_00 == 0) {
          n_00 = 0;
          pCVar6 = pCVar8;
          rep = pCVar12;
        }
        else {
          pCVar6 = (CordRep *)operator_new(0x40);
          (pCVar6->refcount).count_.super___atomic_base<int>._M_i = 2;
          pCVar6->tag = '\x03';
          pCVar6->storage[0] = (uint8_t)(uVar11 - 1);
          pCVar6->storage[1] = '\0';
          pCVar6->storage[2] = '\0';
          pCVar6->length = n_00;
          *(CordRep **)(pCVar8[1].storage + lVar13 * 8 + -0xd) = pCVar6;
          pCVar8->storage[2] = (char)lVar13 + '\x01';
          uVar7 = (pCVar12->super_CordRep).length;
          if (n_00 < uVar7) {
            lVar13 = 0;
            rep = pCVar12;
          }
          else {
            lVar13 = 0;
            do {
              LOCK();
              pRVar1 = &(pCVar12->super_CordRep).refcount;
              (pRVar1->count_).super___atomic_base<int>._M_i =
                   (pRVar1->count_).super___atomic_base<int>._M_i + 2;
              UNLOCK();
              *(CordRepBtree **)(pCVar6[1].storage + lVar13 * 8 + -0xd) = pCVar12;
              uVar10 = lVar13 + uVar9 + 1;
              if (uVar10 < (rep->super_CordRep).storage[1]) goto LAB_0014080f;
              if ((rep->super_CordRep).storage[2] <= uVar10) goto LAB_001407f0;
              n_00 = n_00 - uVar7;
              pCVar12 = (CordRepBtree *)rep->edges_[uVar9 + lVar13 + 1];
              uVar7 = (pCVar12->super_CordRep).length;
              lVar13 = lVar13 + 1;
            } while (uVar7 <= n_00);
            uVar9 = uVar9 + lVar13;
            rep = pCVar12;
          }
        }
        bVar4 = 1 < (long)uVar11;
        pCVar8 = pCVar6;
        uVar11 = uVar11 - 1;
      } while (bVar4);
    }
    if (n_00 != 0) {
      pCVar8 = anon_unknown_10::Substring(&rep->super_CordRep,0,n_00);
      *(CordRep **)(pCVar6[1].storage + lVar13 * 8 + -0xd) = pCVar8;
      lVar13 = lVar13 + 1;
    }
    pCVar6->storage[2] = (uint8_t)lVar13;
    this->index_[0] = (uint8_t)uVar9;
  }
LAB_0014079a:
  RVar14.n = n_00;
  RVar14.tree = local_50;
  return RVar14;
}

Assistant:

ReadResult CordRepBtreeNavigator::Read(size_t edge_offset, size_t n) {
  int height = 0;
  size_t length = edge_offset + n;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);
  assert(edge_offset < edge->length);

  if (length < edge->length) {
    return {Substring(edge, edge_offset, n), length};
  }

  // Similar to 'Skip', we consume all edges that are inside the 'length' of
  // data that needs to be read. If we exhaust the current level, we move one
  // level up the tree and repeat until we hit the final edge that must be
  // (partially) read. We consume all edges into `subtree`.
  CordRepBtree* subtree = CordRepBtree::New(Substring(edge, edge_offset));
  size_t subtree_end = 1;
  do {
    length -= edge->length;
    while (++index == node->end()) {
      index_[height] = static_cast<uint8_t>(index);
      if (++height > height_) {
        subtree->set_end(subtree_end);
        if (length == 0) return {subtree, 0};
        CordRep::Unref(subtree);
        return {nullptr, length};
      }
      if (length != 0) {
        subtree->set_end(subtree_end);
        subtree = CordRepBtree::New(subtree);
        subtree_end = 1;
      }
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
    if (length >= edge->length) {
      subtree->length += edge->length;
      subtree->edges_[subtree_end++] = CordRep::Ref(edge);
    }
  } while (length >= edge->length);
  CordRepBtree* tree = subtree;
  subtree->length += length;

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be read, adding 'down' nodes to `subtree`.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);

    if (length != 0) {
      CordRepBtree* right = CordRepBtree::New(height);
      right->length = length;
      subtree->edges_[subtree_end++] = right;
      subtree->set_end(subtree_end);
      subtree = right;
      subtree_end = 0;
      while (length >= edge->length) {
        subtree->edges_[subtree_end++] = CordRep::Ref(edge);
        length -= edge->length;
        edge = node->Edge(++index);
      }
    }
  }
  // Add any (partial) edge still remaining at the leaf level.
  if (length != 0) {
    subtree->edges_[subtree_end++] = Substring(edge, 0, length);
  }
  subtree->set_end(subtree_end);
  index_[0] = static_cast<uint8_t>(index);
  return {tree, length};
}